

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_unpack.h
# Opt level: O2

void serialization::serialize_unpack<char_const*const*&,serialization::xml_oarchive,int_const&>
               (char ***arg,xml_oarchive *ar,int *front)

{
  xml_oarchive::save_key_start(ar,**arg);
  serialize_helper<serialization::xml_oarchive,int>(ar,front);
  ar->current_ = (ar->current_->super_xml_base<char>).m_parent;
  *arg = *arg + 1;
  return;
}

Assistant:

inline void serialize_unpack(Argument && arg, Archive & ar, T && front, Args && ... next)
{
	serialization_trace trace(__func__, __FILE__, __LINE__);

    auto key = *arg;
    ar.save_key_start(key);
    serialize_helper(ar, front);
    ar.save_key_end(key);

    serialize_unpack(++arg, ar, std::forward<Args>(next)...);
}